

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O0

type __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::
emplace_back<libtorrent::picker_log_alert,libtorrent::aux::stack_allocator&,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::digest32<160l>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::picker_flags_tag,void>const&,std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>&>
          (heterogeneous_queue<libtorrent::alert> *this,stack_allocator *args,torrent_handle *args_1
          ,basic_endpoint<boost::asio::ip::tcp> *args_2,digest32<160L> *args_3,
          bitfield_flag<unsigned_int,_libtorrent::picker_flags_tag,_void> *args_4,
          vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> *args_5)

{
  span<const_libtorrent::piece_block> blocks;
  size_t this_00;
  bitfield_flag<unsigned_int,_libtorrent::picker_flags_tag,_void> *peer_id;
  digest32<160L> *ep;
  basic_endpoint<boost::asio::ip::tcp> *h;
  torrent_handle *alloc;
  pointer pcVar1;
  size_t sVar2;
  piece_block *local_70;
  difference_type local_68;
  picker_flags_t local_5c;
  picker_log_alert *ret;
  header_t *hdr;
  size_t pad_bytes;
  char *ptr;
  bitfield_flag<unsigned_int,_libtorrent::picker_flags_tag,_void> *args_local_4;
  digest32<160L> *args_local_3;
  basic_endpoint<boost::asio::ip::tcp> *args_local_2;
  torrent_handle *args_local_1;
  stack_allocator *args_local;
  heterogeneous_queue<libtorrent::alert> *this_local;
  
  ptr = (char *)args_4;
  args_local_4 = (bitfield_flag<unsigned_int,_libtorrent::picker_flags_tag,_void> *)args_3;
  args_local_3 = (digest32<160L> *)args_2;
  args_local_2 = (basic_endpoint<boost::asio::ip::tcp> *)args_1;
  args_local_1 = (torrent_handle *)args;
  args_local = (stack_allocator *)this;
  if ((ulong)(long)this->m_capacity < (long)this->m_size + 0xc0U) {
    grow_capacity(this,0xc0);
  }
  pcVar1 = std::unique_ptr<char,_libtorrent::aux::free_deleter>::get(&this->m_storage);
  pad_bytes = (size_t)(pcVar1 + this->m_size);
  hdr = (header_t *)libtorrent::aux::calculate_pad_bytes((char *)(pad_bytes + 0x10),8);
  ret = (picker_log_alert *)pad_bytes;
  *(char *)(pad_bytes + 2) = (char)hdr;
  *(code **)(pad_bytes + 8) = move<libtorrent::picker_log_alert>;
  pad_bytes = (long)&hdr[1].len + pad_bytes;
  sVar2 = libtorrent::aux::calculate_pad_bytes((char *)(pad_bytes + 0xa8),8);
  alloc = args_local_1;
  h = args_local_2;
  ep = args_local_3;
  peer_id = args_local_4;
  this_00 = pad_bytes;
  *(short *)&(ret->super_peer_alert).super_torrent_alert.super_alert._vptr_alert =
       (short)sVar2 + 0xa8;
  local_5c.m_val = *(uint *)ptr;
  span<libtorrent::piece_block_const>::
  span<std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>,libtorrent::piece_block,void>
            ((span<libtorrent::piece_block_const> *)&local_70,args_5);
  blocks.m_len = local_68;
  blocks.m_ptr = local_70;
  picker_log_alert::picker_log_alert
            ((picker_log_alert *)this_00,(stack_allocator *)alloc,(torrent_handle *)h,(endpoint *)ep
             ,(peer_id *)peer_id,local_5c,blocks);
  this->m_num_items = this->m_num_items + 1;
  this->m_size = (int)hdr + 0x10 +
                 (uint)*(ushort *)
                        &(ret->super_peer_alert).super_torrent_alert.super_alert._vptr_alert +
                 this->m_size;
  return (type)this_00;
}

Assistant:

typename std::enable_if<std::is_base_of<T, U>::value, U&>::type
		emplace_back(Args&&... args)
		{
			// make the conservative assumption that we'll need the maximum padding
			// for this object, just for purposes of growing the storage
			if (std::size_t(m_size) + sizeof(header_t) + alignof(U) + sizeof(U) > std::size_t(m_capacity))
				grow_capacity(sizeof(header_t) + alignof(U) + sizeof(U));

			char* ptr = m_storage.get() + m_size;

			std::size_t const pad_bytes = aux::calculate_pad_bytes(ptr + sizeof(header_t), alignof(U));

			// pad_bytes is only 8 bits in the header, so types that need more than
			// 256 byte alignment may not be supported
			static_assert(alignof(U) <= 256
				, "heterogeneous_queue does not support types with alignment requirements > 256");

			// if this assert triggers, the type being added to the queue has
			// alignment requirements stricter than what malloc() returns. This is
			// not supported
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(m_storage.get())
				& (alignof(U) - 1)) == 0);

			// make sure the current position in the storage is aligned for
			// creating a heder_t object
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(header_t) - 1)) == 0);

			// length prefix
			header_t* hdr = new (ptr) header_t;
			hdr->pad_bytes = static_cast<std::uint8_t>(pad_bytes);
			hdr->move = &move<U>;
			ptr += sizeof(header_t) + pad_bytes;
			hdr->len = static_cast<std::uint16_t>(sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(U),  alignof(header_t)));

			// make sure ptr is correctly aligned for the object we're about to
			// create there
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(U) - 1)) == 0);

			// construct in-place
			U* const ret = new (ptr) U(std::forward<Args>(args)...);

			// if we constructed the object without throwing any exception
			// update counters to indicate the new item is in there
			++m_num_items;
			m_size += int(sizeof(header_t) + pad_bytes + hdr->len);
			return *ret;
		}